

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O0

void nni_lmq_flush(nni_lmq *lmq)

{
  size_t sVar1;
  nni_msg *m;
  nng_msg *msg;
  nni_lmq *lmq_local;
  
  while (lmq->lmq_len != 0) {
    sVar1 = lmq->lmq_get;
    lmq->lmq_get = sVar1 + 1;
    m = lmq->lmq_msgs[sVar1];
    lmq->lmq_get = lmq->lmq_mask & lmq->lmq_get;
    lmq->lmq_len = lmq->lmq_len - 1;
    nni_msg_free(m);
  }
  return;
}

Assistant:

void
nni_lmq_flush(nni_lmq *lmq)
{
	while (lmq->lmq_len > 0) {
		nng_msg *msg = lmq->lmq_msgs[lmq->lmq_get++];
		lmq->lmq_get &= lmq->lmq_mask;
		lmq->lmq_len--;
		nni_msg_free(msg);
	}
}